

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

String * __thiscall CommandInfo::signature(String *__return_storage_ptr__,CommandInfo *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  CommandArgument *pCVar4;
  String local_e0;
  byte local_b9;
  undefined1 local_b8 [7];
  bool isString;
  String local_98;
  int local_78;
  byte local_71;
  int i;
  bool hasoptionals;
  String local_40;
  undefined1 local_19;
  CommandInfo *local_18;
  CommandInfo *this_local;
  String *text;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CommandInfo *)__return_storage_ptr__;
  String::String(__return_storage_ptr__);
  dataTypeName(&local_40,this->returnvalue);
  String::operator+=(__return_storage_ptr__,&local_40);
  String::~String(&local_40);
  String::operator+=(__return_storage_ptr__,' ');
  String::String((String *)&i,&this->name);
  String::operator+=(__return_storage_ptr__,(String *)&i);
  String::~String((String *)&i);
  bVar2 = List<CommandArgument>::isEmpty(&this->args);
  if (!bVar2) {
    String::operator+=(__return_storage_ptr__,' ');
  }
  String::operator+=(__return_storage_ptr__,'(');
  local_71 = 0;
  for (local_78 = 0; iVar1 = local_78, iVar3 = List<CommandArgument>::size(&this->args),
      iVar1 < iVar3; local_78 = local_78 + 1) {
    if (local_78 == this->minargs) {
      local_71 = 1;
      String::operator+=(__return_storage_ptr__,'[');
    }
    if (local_78 != 0) {
      String::operator+=(__return_storage_ptr__,", ");
    }
    pCVar4 = List<CommandArgument>::operator[](&this->args,local_78);
    dataTypeName(&local_98,pCVar4->type);
    String::operator+=(__return_storage_ptr__,&local_98);
    String::~String(&local_98);
    String::operator+=(__return_storage_ptr__,' ');
    pCVar4 = List<CommandArgument>::operator[](&this->args,local_78);
    String::String((String *)local_b8,&pCVar4->name);
    String::operator+=(__return_storage_ptr__,(String *)local_b8);
    String::~String((String *)local_b8);
    if (this->minargs <= local_78) {
      pCVar4 = List<CommandArgument>::operator[](&this->args,local_78);
      local_b9 = pCVar4->type == TYPE_String;
      String::operator+=(__return_storage_ptr__," = ");
      if ((local_b9 & 1) != 0) {
        String::operator+=(__return_storage_ptr__,'\"');
      }
      pCVar4 = List<CommandArgument>::operator[](&this->args,local_78);
      String::fromNumber(&local_e0,pCVar4->defvalue);
      String::operator+=(__return_storage_ptr__,&local_e0);
      String::~String(&local_e0);
      if ((local_b9 & 1) != 0) {
        String::operator+=(__return_storage_ptr__,'\"');
      }
    }
  }
  if ((local_71 & 1) != 0) {
    String::operator+=(__return_storage_ptr__,']');
  }
  String::operator+=(__return_storage_ptr__,')');
  return __return_storage_ptr__;
}

Assistant:

String CommandInfo::signature()
{
	String text;
	text += dataTypeName (returnvalue);
	text += ' ';
	text += name;

	if (args.isEmpty() == false)
		text += ' ';

	text += '(';

	bool hasoptionals = false;

	for (int i = 0; i < args.size(); i++)
	{
		if (i == minargs)
		{
			hasoptionals = true;
			text += '[';
		}

		if (i)
			text += ", ";

		text += dataTypeName (args[i].type);
		text += ' ';
		text += args[i].name;

		if (i >= minargs)
		{
			bool isString = args[i].type == TYPE_String;
			text += " = ";

			if (isString)
				text += '"';

			text += String::fromNumber (args[i].defvalue);

			if (isString)
				text += '"';
		}
	}

	if (hasoptionals)
		text += ']';

	text += ')';
	return text;
}